

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::CreateScriptContext_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  byte *pbVar1;
  TTD_LOG_PTR_ID TVar2;
  
  if (evt->EventKind == CreateScriptContextActionTag) {
    pbVar1 = SlabAllocatorBase<8>::SlabAllocateTypeRawSize<32ul>(alloc);
    evt[1].EventTimeStamp = (int64)pbVar1;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    TVar2 = FileReader::ReadLogTag(reader,logTag,false);
    evt[1].EventKind = (int)TVar2;
    evt[1].ResultStatus = (int)(TVar2 >> 0x20);
    TVar2 = FileReader::ReadLogTag(reader,logTag,true);
    *(TTD_LOG_PTR_ID *)evt[1].EventTimeStamp = TVar2;
    TVar2 = FileReader::ReadLogTag(reader,logTag,true);
    *(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 8) = TVar2;
    TVar2 = FileReader::ReadLogTag(reader,logTag,true);
    *(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x10) = TVar2;
    TVar2 = FileReader::ReadLogTag(reader,logTag,true);
    *(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x18) = TVar2;
    (*reader->_vptr_FileReader[5])(reader);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void CreateScriptContext_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);
            cAction->KnownObjects = alloc.SlabAllocateStruct<JsRTCreateScriptContextAction_KnownObjects>();

            reader->ReadSequenceStart_WDefaultKey(true);
            cAction->GlobalObject = reader->ReadLogTag(NSTokens::Key::logTag, false);
            cAction->KnownObjects->UndefinedObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->NullObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->TrueObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            cAction->KnownObjects->FalseObject = reader->ReadLogTag(NSTokens::Key::logTag, true);
            reader->ReadSequenceEnd();
        }